

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

Ea<(moira::Mode)2,_(moira::Size)1> * __thiscall
moira::Moira::Op<(moira::Mode)2,(moira::Size)1>
          (Ea<(moira::Mode)2,_(moira::Size)1> *__return_storage_ptr__,Moira *this,u16 reg,u32 *pc)

{
  u32 *pc_local;
  u16 reg_local;
  Moira *this_local;
  
  __return_storage_ptr__->reg = reg;
  __return_storage_ptr__->pc = *pc;
  return __return_storage_ptr__;
}

Assistant:

Ea<M,S>
Moira::Op(u16 reg, u32 &pc)
{
    Ea<M,S> result;
    result.reg = reg;
    result.pc = pc;

    // Read extension words
    switch (M)
    {
        case 5:  // (d,An)
        case 7:  // ABS.W
        case 9:  // (d,PC)
        {
            result.ext1 = dasmRead<Word>(pc);
            break;
        }
        case 8:  // ABS.L
        {
            result.ext1 = dasmRead<Word>(pc);
            result.ext1 = result.ext1 << 16 | dasmRead<Word>(pc);
            break;
        }
        case 6:  // (d,An,Xi)
        case 10: // (d,PC,Xi)
        {
            result.ext1 = dasmRead<Word>(pc);
            result.ext2 = 0;
            result.ext3 = 0;

            if (result.ext1 & 0x100) {

                int dw = baseDispWords(result.ext1);
                if (dw == 1) result.ext2 = dasmRead<Word>(pc);
                if (dw == 2) result.ext2 = dasmRead<Long>(pc);

                int ow = outerDispWords(result.ext1);
                if (ow == 1) result.ext3 = dasmRead<Word>(pc);
                if (ow == 2) result.ext3 = dasmRead<Long>(pc);
            }
            break;
        }
        case 11: // Imm
        {
            result.ext1 = dasmRead<S>(pc);
            break;
        }
        default:
        {
            break;
        }
    }

    return result;
}